

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O3

int CNetBan::CNetHash::MakeHashArray(NETADDR_conflict *pAddr,CNetHash *aHash)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int Sum;
  
  lVar2 = 0x10;
  if (pAddr->type == 1) {
    lVar2 = 4;
  }
  aHash->m_Hash = 0;
  aHash->m_HashIndex = 0;
  bVar4 = 0;
  lVar3 = 0;
  do {
    bVar4 = bVar4 + pAddr->ip[lVar3];
    aHash[lVar3 + 1].m_Hash = (uint)bVar4;
    lVar1 = lVar3 + 1;
    aHash[lVar3 + 1].m_HashIndex = (int)lVar2 - 1U & (uint)lVar1;
    lVar3 = lVar1;
  } while (lVar2 != lVar1);
  return (int)lVar2;
}

Assistant:

int CNetBan::CNetHash::MakeHashArray(const NETADDR *pAddr, CNetHash aHash[17])
{
	int Length = pAddr->type==NETTYPE_IPV4 ? 4 : 16;
	aHash[0].m_Hash = 0;
	aHash[0].m_HashIndex = 0;
	for(int i = 1, Sum = 0; i <= Length; ++i)
	{
		Sum += pAddr->ip[i-1];
		aHash[i].m_Hash = Sum&0xFF;
		aHash[i].m_HashIndex = i%Length;
	}
	return Length;
}